

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::PopScope(cmMakefile *this)

{
  cmGlobalGenerator *this_00;
  cmFileLockPool *this_01;
  cmMakefile *this_local;
  
  this_00 = GetGlobalGenerator(this);
  this_01 = cmGlobalGenerator::GetFileLockPool(this_00);
  cmFileLockPool::PopFunctionScope(this_01);
  PopLoopBlockBarrier(this);
  CheckForUnusedVariables(this);
  PopSnapshot(this,true);
  return;
}

Assistant:

void cmMakefile::PopScope()
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->GetGlobalGenerator()->GetFileLockPool().PopFunctionScope();
#endif

  this->PopLoopBlockBarrier();

  this->CheckForUnusedVariables();

  this->PopSnapshot();
}